

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FramebufferCache.cpp
# Opt level: O2

void __thiscall
Diligent::FramebufferCache::OnDestroyRenderPass(FramebufferCache *this,VkRenderPass Pass)

{
  iterator __it;
  _Node_iterator<std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>,_false,_false>
  it;
  _Node_iterator_base<std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>,_false>
  _Var1;
  Uint32 rt;
  ulong uVar2;
  pair<std::__detail::_Node_iterator<std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>,_false,_false>,_std::__detail::_Node_iterator<std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>,_false,_false>_>
  pVar3;
  anon_class_16_2_3fd5c1ec PurgeViewToKeyMap;
  VkRenderPass local_48;
  anon_class_16_2_3fd5c1ec local_40;
  
  local_48 = Pass;
  std::mutex::lock(&this->m_Mutex);
  pVar3 = std::
          _Hashtable<VkRenderPass_T_*,_std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>,_std::allocator<std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>_>,_std::__detail::_Select1st,_std::equal_to<VkRenderPass_T_*>,_std::hash<VkRenderPass_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
          ::equal_range(&(this->m_RenderPassToKeyMap)._M_h,&local_48);
  for (_Var1._M_cur = (__node_type *)
                      pVar3.first.
                      super__Node_iterator_base<std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>,_false>
                      ._M_cur;
      (_Node_iterator_base<std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>,_false>
       )_Var1._M_cur !=
      (_Node_iterator_base<std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>,_false>
       )pVar3.second.
        super__Node_iterator_base<std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>,_false>
        ._M_cur; _Var1._M_cur = (__node_type *)((_Var1._M_cur)->super__Hash_node_base)._M_nxt) {
    __it = std::
           _Hashtable<Diligent::FramebufferCache::FramebufferCacheKey,_std::pair<const_Diligent::FramebufferCache::FramebufferCacheKey,_VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)13>_>,_std::allocator<std::pair<const_Diligent::FramebufferCache::FramebufferCacheKey,_VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)13>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::FramebufferCache::FramebufferCacheKey>,_Diligent::FramebufferCache::FramebufferCacheKeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::find(&(this->m_Cache)._M_h,
                  (key_type *)
                  ((long)&((_Var1._M_cur)->
                          super__Hash_node_value<std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>,_false>
                          ).
                          super__Hash_node_value_base<std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>_>
                          ._M_storage._M_storage + 8));
    if (__it.
        super__Node_iterator_base<std::pair<const_Diligent::FramebufferCache::FramebufferCacheKey,_VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)13>_>,_true>
        ._M_cur != (__node_type *)0x0) {
      RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,Diligent::ICommandQueueVk>
      ::
      SafeReleaseDeviceObject<VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T*,(VulkanUtilities::VulkanHandleTypeId)13>,void>
                ((RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,Diligent::ICommandQueueVk>
                  *)this->m_DeviceVk,
                 (VulkanObjectWrapper<VkFramebuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)13> *)
                 ((long)__it.
                        super__Node_iterator_base<std::pair<const_Diligent::FramebufferCache::FramebufferCacheKey,_VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)13>_>,_true>
                        ._M_cur + 0x78),
                 *(Uint64 *)
                  ((long)&((_Var1._M_cur)->
                          super__Hash_node_value<std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>,_false>
                          ).
                          super__Hash_node_value_base<std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>_>
                          ._M_storage._M_storage + 0x68));
      std::
      _Hashtable<Diligent::FramebufferCache::FramebufferCacheKey,_std::pair<const_Diligent::FramebufferCache::FramebufferCacheKey,_VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)13>_>,_std::allocator<std::pair<const_Diligent::FramebufferCache::FramebufferCacheKey,_VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)13>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::FramebufferCache::FramebufferCacheKey>,_Diligent::FramebufferCache::FramebufferCacheKeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::erase(&(this->m_Cache)._M_h,
              (const_iterator)
              __it.
              super__Node_iterator_base<std::pair<const_Diligent::FramebufferCache::FramebufferCacheKey,_VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)13>_>,_true>
              ._M_cur);
    }
    local_40.Pass = local_48;
    local_40.this = this;
    for (uVar2 = 0;
        uVar2 < *(uint *)((long)&((_Var1._M_cur)->
                                 super__Hash_node_value<std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>,_false>
                                 ).
                                 super__Hash_node_value_base<std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>_>
                                 ._M_storage._M_storage + 0x10); uVar2 = uVar2 + 1) {
      OnDestroyRenderPass::anon_class_16_2_3fd5c1ec::operator()
                (&local_40,
                 *(VkImageView *)
                  ((long)&((_Var1._M_cur)->
                          super__Hash_node_value<std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>,_false>
                          ).
                          super__Hash_node_value_base<std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>_>
                          ._M_storage._M_storage + uVar2 * 8 + 0x20));
    }
    OnDestroyRenderPass::anon_class_16_2_3fd5c1ec::operator()
              (&local_40,
               *(VkImageView *)
                ((long)&((_Var1._M_cur)->
                        super__Hash_node_value<std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>,_false>
                        ).
                        super__Hash_node_value_base<std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>_>
                        ._M_storage._M_storage + 0x18));
    OnDestroyRenderPass::anon_class_16_2_3fd5c1ec::operator()
              (&local_40,
               *(VkImageView *)
                ((long)&((_Var1._M_cur)->
                        super__Hash_node_value<std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>,_false>
                        ).
                        super__Hash_node_value_base<std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>_>
                        ._M_storage._M_storage + 0x60));
  }
  std::
  _Hashtable<VkRenderPass_T_*,_std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>,_std::allocator<std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>_>,_std::__detail::_Select1st,_std::equal_to<VkRenderPass_T_*>,_std::hash<VkRenderPass_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
  ::erase(&(this->m_RenderPassToKeyMap)._M_h,
          (_Node_iterator_base<std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>,_false>
           )pVar3.first.
            super__Node_iterator_base<std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>,_false>
            ._M_cur,
          (const_iterator)
          pVar3.second.
          super__Node_iterator_base<std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>,_false>
          ._M_cur);
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_Mutex);
  return;
}

Assistant:

void FramebufferCache::OnDestroyRenderPass(VkRenderPass Pass)
{
    std::lock_guard<std::mutex> Lock{m_Mutex};

    auto equal_range = m_RenderPassToKeyMap.equal_range(Pass);
    for (auto it = equal_range.first; it != equal_range.second; ++it)
    {
        const FramebufferCacheKey& Key = it->second;

        auto fb_it = m_Cache.find(Key);
        // Multiple image views may be associated with the same key.
        // The framebuffer is deleted whenever any of the image views or render pass is destroyed
        if (fb_it != m_Cache.end())
        {
            m_DeviceVk.SafeReleaseDeviceObject(std::move(fb_it->second), it->second.CommandQueueMask);
            m_Cache.erase(fb_it);
        }

        // Remove all keys from m_ViewToKeyMap that use the render pass
        auto PurgeViewToKeyMap = [this, Pass](VkImageView vkView) {
            if (vkView == VK_NULL_HANDLE)
                return;
            auto view_it_range = m_ViewToKeyMap.equal_range(vkView);
            for (auto view_it = view_it_range.first; view_it != view_it_range.second;)
            {
                if (view_it->second.Pass == Pass)
                    view_it = m_ViewToKeyMap.erase(view_it);
                else
                    ++view_it;
            }
        };
        for (Uint32 rt = 0; rt < Key.NumRenderTargets; ++rt)
        {
            PurgeViewToKeyMap(Key.RTVs[rt]);
        }
        PurgeViewToKeyMap(Key.DSV);
        PurgeViewToKeyMap(Key.ShadingRate);
    }
    m_RenderPassToKeyMap.erase(equal_range.first, equal_range.second);
}